

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_PluralRulesSelect
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  double state_00;
  bool bVar2;
  UBool UVar3;
  int iVar4;
  CallFlags e;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  Var pvVar7;
  Recycler *pRVar8;
  void **ppvVar9;
  LPCSTR message;
  JavascriptString *pJVar10;
  anon_class_16_2_0ec11e41 executor;
  anon_class_16_2_7f00f5c1 executor_00;
  int in_stack_fffffffffffffe60;
  charcount_t local_164;
  char16 *pcStack_160;
  int selectedLength;
  char16 *selected;
  double nWithOptions;
  FinalizableUNumberFormat **local_148;
  undefined4 local_13c;
  ThreadService *pTStack_138;
  int formattedNLength;
  char16 *formattedN;
  char local_128 [8];
  char localeID [157];
  FinalizableUNumberFormat *nf;
  Var cachedUNumberFormat;
  FinalizableUPluralRules *pr;
  anon_union_8_3_7fb8a913_for_prev aStack_68;
  UErrorCode status;
  double n;
  DynamicObject *state;
  ScriptContext *scriptContext;
  CallInfo CStack_48;
  uint argCount;
  undefined1 local_40 [8];
  Arguments args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  iVar4 = _count_args(callInfo);
  values = _get_va(&stack0x00000000,iVar4);
  args.Values = (Type)callInfo;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),callInfo);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbe2,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  CStack_48 = callInfo;
  Arguments::Arguments((Arguments *)local_40,callInfo,values);
  e = Js::operator&(callInfo._3_4_ &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbe2,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  scriptContext._4_4_ = local_40._0_4_ & 0xffffff;
  state = (DynamicObject *)RecyclableObject::GetScriptContext(function);
  if (scriptContext._4_4_ == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xbe2,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((local_40._0_4_ & 0xffffff) == 3) {
    pvVar7 = Arguments::operator[]((Arguments *)local_40,1);
    bVar2 = DynamicObject::IsBaseDynamicObject(pvVar7);
    if (bVar2) goto LAB_010a0f32;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                              ,0xbe3,
                              "((args.Info.Count == 3 && DynamicObject::IsBaseDynamicObject(args[1])))"
                              ,"Intl platform function given bad arguments");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 0;
LAB_010a0f32:
  pvVar7 = Arguments::operator[]((Arguments *)local_40,1);
  n = (double)UnsafeVarTo<Js::DynamicObject>(pvVar7);
  aStack_68.base = (DListNodeBase<Memory::Recycler::GuestArenaAllocator> *)0x0;
  pvVar7 = Arguments::operator[]((Arguments *)local_40,2);
  bVar2 = TaggedInt::Is(pvVar7);
  if (bVar2) {
    pvVar7 = Arguments::operator[]((Arguments *)local_40,2);
    aStack_68 = (anon_union_8_3_7fb8a913_for_prev)TaggedInt::ToDouble(pvVar7);
  }
  else {
    pvVar7 = Arguments::operator[]((Arguments *)local_40,2);
    bVar2 = JavascriptNumber::Is(pvVar7);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xbed,"(JavascriptNumber::Is(args[2]))",
                                  "JavascriptNumber::Is(args[2])");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pvVar7 = Arguments::operator[]((Arguments *)local_40,2);
    aStack_68 = (anon_union_8_3_7fb8a913_for_prev)JavascriptNumber::GetValue(pvVar7);
  }
  Output::Trace(IntlPhase,L"%S(): Calling PluralRules.prototype.select(%f)\n",aStack_68.base,
                "EntryIntl_PluralRulesSelect");
  pr._4_4_ = U_ZERO_ERROR;
  cachedUNumberFormat = GetOrCreateCachedUPluralRules((DynamicObject *)n,(ScriptContext *)state);
  nf = (FinalizableUNumberFormat *)0x0;
  stack0xffffffffffffff78 = (Type)0x0;
  iVar4 = (**(code **)(*(long *)n + 0xa0))(n,n,10,&nf,0);
  if (iVar4 == 0) {
    memset(local_128,0,0x9d);
    state_00 = n;
    PropertyIds::PropertyIds((PropertyIds *)((long)&formattedN + 4),locale);
    pJVar10 = AssertStringProperty((DynamicObject *)state_00,formattedN._4_4_);
    LangtagToLocaleID<157ul>(pJVar10,(char (*) [157])local_128);
    pRVar8 = ScriptContext::GetRecycler((ScriptContext *)state);
    ppvVar9 = (void **)unum_open_70(1,0,0,local_128);
    register0x00000000 = (Type)FinalizableICUObject<void_**,_&unum_close_70>::New(pRVar8,ppvVar9);
    ppvVar9 = FinalizableICUObject::operator_cast_to_void__
                        ((FinalizableICUObject *)register0x00000000);
    SetUNumberFormatDigitOptions(ppvVar9,(DynamicObject *)n);
    Output::Trace(IntlPhase,L"%S(): Caching UNumberFormat object (0x%x) with localeID %S\n",
                  "EntryIntl_PluralRulesSelect",stack0xffffffffffffff78,local_128);
    (**(code **)(*(long *)n + 200))(n,10,stack0xffffffffffffff78,0,0);
  }
  else {
    stack0xffffffffffffff78 = (Type)nf;
    Output::Trace(IntlPhase,L"%S(): Using previously cached UNumberFormat (0x%x)\n",
                  "EntryIntl_PluralRulesSelect",nf);
  }
  pTStack_138 = (ThreadService *)0x0;
  local_13c = 0;
  nWithOptions = (double)(localeID + 0x98);
  local_148 = (FinalizableUNumberFormat **)&stack0xffffffffffffff98;
  pRVar8 = ScriptContext::GetRecycler((ScriptContext *)state);
  executor.n = (double *)pRVar8;
  executor.nf = local_148;
  EnsureBuffer<Js::IntlEngineInterfaceExtensionObject::EntryIntl_PluralRulesSelect(Js::RecyclableObject*,Js::CallInfo,___)::__0>
            ((Js *)nWithOptions,executor,(Recycler *)&stack0xfffffffffffffec8,(char16 **)&local_13c,
             (int *)0x0,true,in_stack_fffffffffffffe60);
  ppvVar9 = FinalizableICUObject::operator_cast_to_void__
                      ((FinalizableICUObject *)stack0xffffffffffffff78);
  selected = (char16 *)unum_parseDouble_70(ppvVar9,pTStack_138,local_13c,0,(long)&pr + 4);
  if (pr._4_4_ != U_MEMORY_ALLOCATION_ERROR) {
    UVar3 = U_FAILURE(pr._4_4_);
    if ((UVar3 == '\0') && (pr._4_4_ != U_STRING_NOT_TERMINATED_WARNING)) {
      if (((((((double)aStack_68 <= 0.0) || ((double)aStack_68 < (double)selected)) ||
            ((double)selected < 0.0)) &&
           (((0.0 <= (double)aStack_68 || ((double)selected < (double)aStack_68)) ||
            (0.0 < (double)selected)))) &&
          ((((((double)aStack_68 != 0.0 || (NAN((double)aStack_68))) ||
             (((double)selected != 0.0 || (NAN((double)selected))))) &&
            ((((double)aStack_68 <= 0.0 || ((double)aStack_68 < (double)selected)) ||
             ((double)selected < 0.0)))) &&
           (((0.0 <= (double)aStack_68 || ((double)selected < (double)aStack_68)) ||
            (0.0 < (double)selected)))))) &&
         ((((double)aStack_68 != 0.0 || (NAN((double)aStack_68))) ||
          (((double)selected != 0.0 || (NAN((double)selected))))))) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0xc1d,
                                    "((n > 0.0 && nWithOptions <= n && nWithOptions >= 0.0) || (n < 0.0 && nWithOptions >= n && nWithOptions <= 0) || (n == 0.0 && nWithOptions == 0))"
                                    ,
                                    "(n > 0.0 && nWithOptions <= n && nWithOptions >= 0.0) || (n < 0.0 && nWithOptions >= n && nWithOptions <= 0) || (n == 0.0 && nWithOptions == 0)"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      message = (LPCSTR)u_errorName_70(pr._4_4_);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xc1d,"(false)",message);
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pcStack_160 = (char16 *)0x0;
    local_164 = 0;
    pRVar8 = ScriptContext::GetRecycler((ScriptContext *)state);
    executor_00.nWithOptions = (double *)pRVar8;
    executor_00.pr = (FinalizableUPluralRules **)&selected;
    EnsureBuffer<Js::IntlEngineInterfaceExtensionObject::EntryIntl_PluralRulesSelect(Js::RecyclableObject*,Js::CallInfo,___)::__1>
              ((Js *)&cachedUNumberFormat,executor_00,(Recycler *)&stack0xfffffffffffffea0,
               (char16 **)&local_164,(int *)0x0,true,in_stack_fffffffffffffe60);
    pJVar10 = JavascriptString::NewWithBuffer(pcStack_160,local_164,(ScriptContext *)state);
    return pJVar10;
  }
  Throw::OutOfMemory();
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_PluralRulesSelect(RecyclableObject *function, CallInfo callInfo, ...)
    {
#ifdef INTL_ICU
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(args.Info.Count == 3 && DynamicObject::IsBaseDynamicObject(args[1]));

        DynamicObject *state = UnsafeVarTo<DynamicObject>(args[1]);
        double n = 0.0;
        if (TaggedInt::Is(args[2]))
        {
            n = TaggedInt::ToDouble(args[2]);
        }
        else
        {
            AssertOrFailFast(JavascriptNumber::Is(args[2]));
            n = JavascriptNumber::GetValue(args[2]);
        }

        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(PluralRules_Prototype_select);
        INTL_TRACE("Calling PluralRules.prototype.select(%f)", n);

        UErrorCode status = U_ZERO_ERROR;

        FinalizableUPluralRules *pr = GetOrCreateCachedUPluralRules(state, scriptContext);

        // ICU has an internal API, uplrules_selectWithFormat, that is equivalent to uplrules_select but will respect digit options of the passed UNumberFormat.
        // Since its an internal API, we can't use it -- however, we can work around it by creating a UNumberFormat with provided digit options,
        // formatting the requested number to a string, and then converting the string back to a double which we can pass to uplrules_select.
        // This workaround was suggested during the May 2018 ECMA-402 discussion.
        // The below is similar to GetOrCreateCachedUPluralRules, but since creating a UNumberFormat for Intl.NumberFormat is much more involved and no one else
        // uses this functionality, it makes more sense to me to just put the logic inline.
        Var cachedUNumberFormat = nullptr;
        FinalizableUNumberFormat *nf = nullptr;
        if (state->GetInternalProperty(state, InternalPropertyIds::CachedUNumberFormat, &cachedUNumberFormat, nullptr, scriptContext))
        {
            nf = reinterpret_cast<FinalizableUNumberFormat *>(cachedUNumberFormat);
            INTL_TRACE("Using previously cached UNumberFormat (0x%x)", nf);
        }
        else
        {
            char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
            LangtagToLocaleID(AssertStringProperty(state, PropertyIds::locale), localeID);
            nf = FinalizableUNumberFormat::New(scriptContext->GetRecycler(), unum_open(UNUM_DECIMAL, nullptr, 0, localeID, nullptr, &status));

            SetUNumberFormatDigitOptions(*nf, state);

            INTL_TRACE("Caching UNumberFormat object (0x%x) with localeID %S", nf, localeID);

            state->SetInternalProperty(InternalPropertyIds::CachedUNumberFormat, nf, PropertyOperationFlags::PropertyOperation_None, nullptr);
        }

        char16 *formattedN = nullptr;
        int formattedNLength = 0;
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return unum_formatDouble(*nf, n, buf, bufLen, nullptr, status);
        }, scriptContext->GetRecycler(), &formattedN, &formattedNLength);

        double nWithOptions = unum_parseDouble(*nf, reinterpret_cast<UChar *>(formattedN), formattedNLength, nullptr, &status);

        ICU_ASSERT(status, (n > 0.0 && nWithOptions <= n && nWithOptions >= 0.0) ||
            (n < 0.0 && nWithOptions >= n && nWithOptions <= 0) ||
            (n == 0.0 && nWithOptions == 0));

        char16 *selected = nullptr;
        int selectedLength = 0;
        EnsureBuffer([&](UChar *buf, int bufLen, UErrorCode *status)
        {
            return uplrules_select(*pr, nWithOptions, buf, bufLen, status);
        }, scriptContext->GetRecycler(), &selected, &selectedLength);

        return JavascriptString::NewWithBuffer(selected, static_cast<charcount_t>(selectedLength), scriptContext);
#else
        AssertOrFailFastMsg(false, "Intl-WinGlob should not be using PluralRulesSelect");
        return nullptr;
#endif
    }